

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O2

void __thiscall
GrpTokenStreamFilter::ReportParserError(GrpTokenStreamFilter *this,ParserException *ex)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  string *this_00;
  string *msg;
  string local_d0 [32];
  string local_b0 [32];
  undefined1 local_90 [40];
  string local_68;
  string local_48;
  
  iVar3 = (**(code **)(*(long *)&ex->super_ANTLRException + 0x30))(ex);
  pcVar2 = *(code **)(*(long *)&ex->super_ANTLRException + 0x28);
  local_90._0_4_ = iVar3;
  if (this->m_nLastLineMarker < iVar3) {
    (*pcVar2)(&local_68,ex);
    iVar1 = this->m_nLineOffset;
    std::__cxx11::string::string(local_d0,(string *)&this->m_staFile);
    local_90._4_4_ = iVar1 + iVar3;
    std::__cxx11::string::string((string *)(local_90 + 8),local_d0);
    msg = &local_68;
    AddGlobalError(true,0x67,msg,(GrpLineAndFile *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    this_00 = local_d0;
  }
  else {
    (*pcVar2)(&local_48,ex);
    iVar1 = this->m_nPrevLineOffset;
    std::__cxx11::string::string(local_b0,(string *)&this->m_staPrevFile);
    local_90._4_4_ = iVar1 + iVar3;
    std::__cxx11::string::string((string *)(local_90 + 8),local_b0);
    msg = &local_48;
    AddGlobalError(true,0x66,msg,(GrpLineAndFile *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    this_00 = local_b0;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)msg);
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportParserError(const ParserException & ex)
{
	int nLinePre = ex.getLine();
	if (nLinePre <= m_nLastLineMarker)
		//	Problematic token was before the last line marker in the pre-processed file.
		AddGlobalError(true, 102, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nPrevLineOffset, m_staPrevFile));
	else
		AddGlobalError(true, 103, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nLineOffset, m_staFile));
}